

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

void png_build_grayscale_palette(int bit_depth,png_colorp palette)

{
  png_byte pVar1;
  int local_28;
  int local_24;
  int v;
  int i;
  int color_inc;
  int num_palette;
  png_colorp palette_local;
  int bit_depth_local;
  
  if (palette != (png_colorp)0x0) {
    switch(bit_depth) {
    case 1:
      i = 2;
      v = 0xff;
      break;
    case 2:
      i = 4;
      v = 0x55;
      break;
    default:
      i = 0;
      v = 0;
      break;
    case 4:
      i = 0x10;
      v = 0x11;
      break;
    case 8:
      i = 0x100;
      v = 1;
    }
    local_28 = 0;
    for (local_24 = 0; local_24 < i; local_24 = local_24 + 1) {
      pVar1 = (png_byte)local_28;
      palette[local_24].red = pVar1;
      palette[local_24].green = pVar1;
      palette[local_24].blue = pVar1;
      local_28 = v + local_28;
    }
  }
  return;
}

Assistant:

void PNGAPI
png_build_grayscale_palette(int bit_depth, png_colorp palette)
{
   int num_palette;
   int color_inc;
   int i;
   int v;

   png_debug(1, "in png_do_build_grayscale_palette");

   if (palette == NULL)
      return;

   switch (bit_depth)
   {
      case 1:
         num_palette = 2;
         color_inc = 0xff;
         break;

      case 2:
         num_palette = 4;
         color_inc = 0x55;
         break;

      case 4:
         num_palette = 16;
         color_inc = 0x11;
         break;

      case 8:
         num_palette = 256;
         color_inc = 1;
         break;

      default:
         num_palette = 0;
         color_inc = 0;
         break;
   }

   for (i = 0, v = 0; i < num_palette; i++, v += color_inc)
   {
      palette[i].red = (png_byte)(v & 0xff);
      palette[i].green = (png_byte)(v & 0xff);
      palette[i].blue = (png_byte)(v & 0xff);
   }
}